

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::EndAt(LocationRecorder *this,Token *token)

{
  RepeatedField<int> *pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Location *pLVar5;
  LogMessage *other;
  int *piVar6;
  LogMessage local_70;
  LogFinisher local_31;
  
  iVar2 = token->line;
  pLVar5 = this->location_;
  if ((pLVar5->span_).current_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x511);
    other = internal::LogMessage::operator<<(&local_70,"CHECK failed: (index) < (current_size_): ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_70);
  }
  piVar6 = RepeatedField<int>::elements(&pLVar5->span_);
  if (iVar2 != *piVar6) {
    pLVar5 = this->location_;
    iVar2 = token->line;
    pRVar1 = &pLVar5->span_;
    uVar3 = (pLVar5->span_).current_size_;
    uVar4 = (pLVar5->span_).total_size_;
    if (uVar3 == uVar4) {
      RepeatedField<int>::Reserve(pRVar1,uVar4 + 1);
    }
    piVar6 = RepeatedField<int>::elements(pRVar1);
    piVar6[uVar3] = iVar2;
    pRVar1->current_size_ = uVar3 + 1;
  }
  pLVar5 = this->location_;
  iVar2 = token->end_column;
  pRVar1 = &pLVar5->span_;
  uVar3 = (pLVar5->span_).current_size_;
  uVar4 = (pLVar5->span_).total_size_;
  if (uVar3 == uVar4) {
    RepeatedField<int>::Reserve(pRVar1,uVar4 + 1);
  }
  piVar6 = RepeatedField<int>::elements(pRVar1);
  piVar6[uVar3] = iVar2;
  pRVar1->current_size_ = uVar3 + 1;
  return;
}

Assistant:

void Parser::LocationRecorder::EndAt(const io::Tokenizer::Token& token) {
  if (token.line != location_->span(0)) {
    location_->add_span(token.line);
  }
  location_->add_span(token.end_column);
}